

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O2

void __thiscall cxxpool::thread_pool::clear(thread_pool *this)

{
  vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_> local_38;
  
  std::mutex::lock(&this->task_mutex_);
  local_38.
  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->tasks_).c.
       super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->tasks_).c.
       super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->tasks_).c.
       super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->tasks_).c.
  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tasks_).c.
  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tasks_).c.
  super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>::
  ~vector(&local_38);
  pthread_mutex_unlock((pthread_mutex_t *)&this->task_mutex_);
  return;
}

Assistant:

void clear() {
        std::lock_guard<std::mutex> task_lock(task_mutex_);
        decltype(tasks_) empty;
        tasks_.swap(empty);
    }